

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

void __thiscall ANN::~ANN(ANN *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->layerSizes).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<Layer_*,_std::allocator<Layer_*>_>::~_Vector_base
            ((_Vector_base<Layer_*,_std::allocator<Layer_*>_> *)this);
  return;
}

Assistant:

ANN::~ANN()
{
    
}